

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat4x2.c
# Opt level: O0

void glmc_mat4x2_zero(vec2 *m)

{
  undefined4 *in_RDI;
  mat4x2 t;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  
  local_58 = in_RDI;
  memset(&local_78,0,0x20);
  *local_58 = local_78;
  local_58[1] = local_74;
  local_58[2] = local_70;
  local_58[3] = local_6c;
  local_58[4] = local_68;
  local_58[5] = local_64;
  local_58[6] = local_60;
  local_58[7] = local_5c;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat4x2_zero(mat4x2 m) {
  glm_mat4x2_zero(m);
}